

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall Scene::setCamera(Scene *this,Vector *org,Vector *dir,Vector *up)

{
  Vector local_88;
  Vector local_70;
  Vector local_58;
  Vector local_40;
  Vector *local_28;
  Vector *up_local;
  Vector *dir_local;
  Vector *org_local;
  Scene *this_local;
  
  local_28 = up;
  up_local = dir;
  dir_local = org;
  org_local = (Vector *)this;
  Vector::operator=(&this->eye,org);
  Vector::operator=(&this->eye_dir,up_local);
  operator^(&local_58,local_28,up_local);
  normalize(&local_40,&local_58);
  Vector::operator=(&this->view_x,&local_40);
  operator^(&local_88,up_local,&this->view_x);
  normalize(&local_70,&local_88);
  Vector::operator=(&this->view_y,&local_70);
  return;
}

Assistant:

void Scene::setCamera(const Vector &org, const Vector &dir, const Vector &up)
{
   eye     = org;                  // eye point
   eye_dir = dir;                  // viewing direction
   view_x  = normalize(up ^ dir);  // basis vectors
   view_y  = normalize(dir ^ view_x);
}